

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int intEventSetFunc(uint event,void *f,int user,void *userdata)

{
  FILE *__stream;
  char *pcVar1;
  void *in_RCX;
  uint in_EDX;
  callbk_t in_RSI;
  uint in_EDI;
  
  __stream = _stderr;
  if ((4 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar1 = myTimeStamp();
    fprintf(__stream,"%s %s: event=%d function=%08X, user=%d, userdata=%08X\n",pcVar1,
            "intEventSetFunc",(ulong)in_EDI,(ulong)in_RSI & 0xffffffff,in_EDX,(int)in_RCX);
  }
  eventAlert[in_EDI].ex = in_EDX;
  eventAlert[in_EDI].userdata = in_RCX;
  eventAlert[in_EDI].func = in_RSI;
  return 0;
}

Assistant:

static int intEventSetFunc(
   unsigned event,
   void *   f,
   int      user,
   void *   userdata)
{
   DBG(DBG_INTERNAL, "event=%d function=%08X, user=%d, userdata=%08X",
      event, (uint32_t)f, user, (uint32_t)userdata);

   eventAlert[event].ex = user;
   eventAlert[event].userdata = userdata;

   eventAlert[event].func = f;

   return 0;
}